

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PType::VisitedNodeSet::Insert(VisitedNodeSet *this,PType *node)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = Check(this,node);
  if (!bVar1) {
    uVar2 = (ulong)((uint)((ulong)node >> 1) & 0xf8);
    node->VisitNext = *(PType **)((long)this->Buckets + uVar2);
    *(PType **)((long)this->Buckets + uVar2) = node;
    return;
  }
  __assert_fail("!Check(node) && \"Node was already inserted\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0x174,"void PType::VisitedNodeSet::Insert(PType *)");
}

Assistant:

void PType::VisitedNodeSet::Insert(PType *node)
{
	assert(!Check(node) && "Node was already inserted");
	size_t buck = Hash(node) & (countof(Buckets) - 1);
	node->VisitNext = Buckets[buck];
	Buckets[buck] = node;
}